

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::FirstIsBottomPt(OutPt *btmPt1,OutPt *btmPt2)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool local_c6;
  bool local_c5;
  double dx2n;
  double dx2p;
  double dx1n;
  double dx1p;
  OutPt *p;
  OutPt *btmPt2_local;
  OutPt *btmPt1_local;
  
  for (dx1p = (double)btmPt1->prev; bVar1 = PointsEqual((IntPoint *)((long)dx1p + 8),&btmPt1->pt),
      bVar1 && (OutPt *)dx1p != btmPt1; dx1p = *(double *)((long)dx1p + 0x20)) {
  }
  dVar2 = GetDx(btmPt1->pt,*(IntPoint *)((long)dx1p + 8));
  for (dx1p = (double)btmPt1->next; bVar1 = PointsEqual((IntPoint *)((long)dx1p + 8),&btmPt1->pt),
      bVar1 && (OutPt *)dx1p != btmPt1; dx1p = *(double *)((long)dx1p + 0x18)) {
  }
  dVar3 = GetDx(btmPt1->pt,*(IntPoint *)((long)dx1p + 8));
  for (dx1p = (double)btmPt2->prev; bVar1 = PointsEqual((IntPoint *)((long)dx1p + 8),&btmPt2->pt),
      bVar1 && (OutPt *)dx1p != btmPt2; dx1p = *(double *)((long)dx1p + 0x20)) {
  }
  dVar4 = GetDx(btmPt2->pt,*(IntPoint *)((long)dx1p + 8));
  for (dx1p = (double)btmPt2->next; bVar1 = PointsEqual((IntPoint *)((long)dx1p + 8),&btmPt2->pt),
      bVar1 && (OutPt *)dx1p != btmPt2; dx1p = *(double *)((long)dx1p + 0x18)) {
  }
  dVar5 = GetDx(btmPt2->pt,*(IntPoint *)((long)dx1p + 8));
  if ((ABS(dVar2) < ABS(dVar4)) || (local_c5 = true, ABS(dVar2) < ABS(dVar5))) {
    local_c6 = ABS(dVar4) <= ABS(dVar3) && ABS(dVar5) <= ABS(dVar3);
    local_c5 = local_c6;
  }
  return local_c5;
}

Assistant:

bool FirstIsBottomPt(const OutPt* btmPt1, const OutPt* btmPt2)
{
  OutPt *p = btmPt1->prev;
  while (PointsEqual(p->pt, btmPt1->pt) && (p != btmPt1)) p = p->prev;
  double dx1p = std::fabs(GetDx(btmPt1->pt, p->pt));
  p = btmPt1->next;
  while (PointsEqual(p->pt, btmPt1->pt) && (p != btmPt1)) p = p->next;
  double dx1n = std::fabs(GetDx(btmPt1->pt, p->pt));

  p = btmPt2->prev;
  while (PointsEqual(p->pt, btmPt2->pt) && (p != btmPt2)) p = p->prev;
  double dx2p = std::fabs(GetDx(btmPt2->pt, p->pt));
  p = btmPt2->next;
  while (PointsEqual(p->pt, btmPt2->pt) && (p != btmPt2)) p = p->next;
  double dx2n = std::fabs(GetDx(btmPt2->pt, p->pt));
  return (dx1p >= dx2p && dx1p >= dx2n) || (dx1n >= dx2p && dx1n >= dx2n);
}